

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::extToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Extrapolation ext)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((uint)this < 4) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)0x0,
               (ulong)(&DAT_0010ba90 + *(int *)(&DAT_0010ba90 + ((ulong)this & 0xffffffff) * 4)));
  }
  return __return_storage_ptr__;
}

Assistant:

string
extToString (Extrapolation ext)
{
    string str;

    switch (ext)
    {
        case BLACK: str = "black"; break;

        case CLAMP: str = "clamp"; break;

        case PERIODIC: str = "periodic"; break;

        case MIRROR: str = "mirror"; break;
    }

    return str;
}